

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

bool __thiscall QFutureInterfaceBase::waitForNextResult(QFutureInterfaceBase *this)

{
  long lVar1;
  byte bVar2;
  long in_FS_OFFSET;
  QMutexLocker<QMutex> lock;
  QMutex *in_stack_ffffffffffffffb8;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  bVar2 = QFutureInterfaceBasePrivate::internal_waitForNextResult
                    ((QFutureInterfaceBasePrivate *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QFutureInterfaceBase::waitForNextResult()
{
    QMutexLocker lock(&d->m_mutex);
    return d->internal_waitForNextResult();
}